

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O2

bool __thiscall ritobin::io::impl_text_read::TextReader::read_bool(TextReader *this,bool *value)

{
  bool bVar1;
  bool bVar2;
  string_view __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  
  __x = read_word(this);
  if (__x._M_len == 0) {
    bVar1 = false;
  }
  else {
    __y._M_str = "true";
    __y._M_len = 4;
    bVar1 = std::operator==(__x,__y);
    bVar2 = true;
    if (!bVar1) {
      __y_00._M_str = "false";
      __y_00._M_len = 5;
      bVar1 = std::operator==(__x,__y_00);
      bVar2 = false;
      if (!bVar1) {
        return false;
      }
    }
    *value = bVar2;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool read_bool(bool& value) noexcept {
            auto const word = read_word();
            if (word.empty()) {
                return false;
            }
            if (word == "true") {
                value = true;
                return true;
            }
            else if (word == "false") {
                value = false;
                return true;
            }
            else {
                return false;
            }
        }